

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O3

_Bool menu_handle_keypress(menu_conflict *menu,ui_event *in,ui_event *out)

{
  uint uVar1;
  keycode_t kVar2;
  byte *pbVar3;
  byte bVar4;
  _Bool _Var5;
  ui_event_type uVar6;
  wchar_t wVar7;
  int cursor;
  int *piVar8;
  __int32_t **pp_Var9;
  ushort **ppuVar10;
  int iVar11;
  uint cursor_00;
  ui_event uVar16;
  uint8_t extraout_DL;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  char c;
  
  piVar8 = &menu->filter_count;
  if (menu->filter_list == (int *)0x0) {
    piVar8 = &menu->count;
  }
  uVar1 = *piVar8;
  uVar14 = (ulong)in->mouse >> 0x20;
  uVar13 = menu->flags;
  if ((uVar13 & 8) != 0) {
    pp_Var9 = __ctype_toupper_loc();
    uVar14 = (ulong)(uint)(*pp_Var9)[uVar14 & 0xff];
  }
  uVar15 = uVar14;
  if ((((uVar13 & 0x40) != 0) &&
      (ppuVar10 = __ctype_b_loc(), (*(byte *)((long)*ppuVar10 + (uVar14 & 0xff) * 2 + 1) & 8) != 0))
     && (uVar15 = (ulong)(byte)menu->inscriptions[(int)uVar14 - 0x30],
        menu->inscriptions[(int)uVar14 - 0x30] == 0)) {
    uVar15 = uVar14;
  }
  if ((uVar13 & 2) == 0) {
    bVar12 = (byte)uVar15;
    if ((uVar13 & 1) == 0) {
      if (((uVar13 & 4) == 0) && (pbVar3 = (byte *)menu->selections, pbVar3 != (byte *)0x0)) {
        bVar4 = *pbVar3;
        if (bVar4 != 0) {
          uVar14 = 0;
          do {
            if ((uVar13 & 8) != 0) {
              pp_Var9 = __ctype_toupper_loc();
              bVar4 = *(byte *)(*pp_Var9 + bVar4);
            }
            if (bVar12 == bVar4) goto LAB_001f5375;
            bVar4 = pbVar3[uVar14 + 1];
            uVar14 = uVar14 + 1;
          } while (bVar4 != 0);
        }
      }
      else if ((menu->row_funcs->get_tag != (_func_char_menu_ptr_int *)0x0) && (0 < (int)uVar1)) {
        uVar14 = 0;
        do {
          if (menu->filter_list == (int *)0x0) {
            iVar11 = (int)uVar14;
          }
          else {
            iVar11 = menu->filter_list[uVar14];
          }
          bVar4 = (*menu->row_funcs->get_tag)(menu,iVar11);
          if (((menu->flags & 8) != 0) && (bVar4 != 0)) {
            pp_Var9 = __ctype_toupper_loc();
            bVar4 = *(byte *)(*pp_Var9 + bVar4);
          }
          if ((bVar4 != 0) && (bVar12 == bVar4)) goto LAB_001f5375;
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
    }
    else if (0 < (int)uVar1) {
      uVar13 = 0;
      do {
        bVar4 = (*menu->skin->get_tag)(menu,uVar13);
        if (((menu->flags & 8) != 0) && (bVar4 != 0)) {
          pp_Var9 = __ctype_toupper_loc();
          bVar4 = *(byte *)(*pp_Var9 + bVar4);
        }
        if ((bVar4 != 0) && (bVar12 == bVar4)) {
          uVar14 = (ulong)(uVar13 + menu->top);
          goto LAB_001f5375;
        }
        uVar13 = uVar13 + 1;
      } while (uVar1 != uVar13);
    }
  }
LAB_001f53b5:
  kVar2 = (in->key).code;
  if (kVar2 == 0xe000) {
    out->type = EVT_ESCAPE;
  }
  else {
    if ((int)uVar1 < 1) {
      return true;
    }
    if (kVar2 == 0x9c) {
      out->type = EVT_SELECT;
    }
    else {
      if (kVar2 == 0x20) {
        iVar11 = (menu->active).page_rows;
        if (iVar11 < (int)uVar1) {
          iVar11 = iVar11 + menu->cursor;
          if ((int)(uVar1 - 1) <= iVar11) {
            iVar11 = 0;
          }
          menu->cursor = iVar11;
          menu->top = iVar11;
          out->type = EVT_MOVE;
          return false;
        }
        return true;
      }
      wVar7 = target_dir(in->key);
      if (wVar7 != L'\0') {
        _Var5 = is_valid_row(menu,0);
        if (!_Var5) {
          uVar13 = 1;
          do {
            cursor_00 = uVar13;
            if (uVar1 == cursor_00) break;
            _Var5 = is_valid_row(menu,cursor_00);
            uVar13 = cursor_00 + 1;
          } while (!_Var5);
          if ((int)uVar1 <= (int)cursor_00) {
            return false;
          }
        }
        uVar16._0_8_ = (*menu->skin->process_dir)(menu,wVar7);
        out->mouse = uVar16.mouse;
        (out->key).mods = extraout_DL;
        if (uVar16.mouse.type == EVT_MOVE) {
          _Var5 = is_valid_row(menu,menu->cursor);
          if (!_Var5) {
            do {
              iVar11 = menu->cursor;
              cursor = 0;
              if ((iVar11 < (int)uVar1) && (cursor = uVar1 - 1, -1 < iVar11)) {
                cursor = iVar11 + ddy[wVar7];
              }
              menu->cursor = cursor;
              _Var5 = is_valid_row(menu,cursor);
            } while (!_Var5);
          }
          if (menu->cursor < 0) {
            __assert_fail("menu->cursor >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                          ,0x2ec,
                          "_Bool menu_handle_keypress(struct menu *, const ui_event *, ui_event *)")
            ;
          }
          if ((int)uVar1 <= menu->cursor) {
            __assert_fail("menu->cursor < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                          ,0x2ed,
                          "_Bool menu_handle_keypress(struct menu *, const ui_event *, ui_event *)")
            ;
          }
        }
      }
    }
  }
  return false;
LAB_001f5375:
  iVar11 = (int)uVar14;
  if ((-1 < iVar11) && (_Var5 = is_valid_row(menu,iVar11), _Var5)) {
    uVar6 = EVT_SELECT;
    if ((menu->flags & 0x10) != 0) {
      uVar6 = (uint)(iVar11 == menu->cursor) * 0x20 + EVT_MOVE;
    }
    out->type = uVar6;
    menu->cursor = iVar11;
    return false;
  }
  goto LAB_001f53b5;
}

Assistant:

bool menu_handle_keypress(struct menu *menu, const ui_event *in,
		ui_event *out)
{
	bool eat = false;
	int count = menu->filter_list ? menu->filter_count : menu->count;

	/* Get the new cursor position from the menu item tags */
	int new_cursor = get_cursor_key(menu, menu->top, in->key);
	if (new_cursor >= 0 && is_valid_row(menu, new_cursor)) {
		if (!(menu->flags & MN_DBL_TAP) || new_cursor == menu->cursor)
			out->type = EVT_SELECT;
		else
			out->type = EVT_MOVE;

		menu->cursor = new_cursor;
	} else if (in->key.code == ESCAPE) {
		/* Escape stops us here */
		out->type = EVT_ESCAPE;
	} else if (count <= 0) {
		/* Menus with no rows can't be navigated or used, so eat keypresses */
		eat = true;
	} else if (in->key.code == ' ') {
		/* Try existing, known keys */
		int rows = menu->active.page_rows;
		int total = count;

		if (rows < total) {
			/* Go to start of next page */
			menu->cursor += menu->active.page_rows;
			if (menu->cursor >= total - 1) menu->cursor = 0;
			menu->top = menu->cursor;
	
			out->type = EVT_MOVE;
		} else {
			eat = true;
		}
	} else if (in->key.code == KC_ENTER) {
		out->type = EVT_SELECT;
	} else {
		/* Try directional movement */
		int dir = target_dir(in->key);

		if (dir && !no_valid_row(menu, count)) {
			*out = menu->skin->process_dir(menu, dir);

			if (out->type == EVT_MOVE) {
				while (!is_valid_row(menu, menu->cursor)) {
					/* Loop around */
					if (menu->cursor > count - 1)
						menu->cursor = 0;
					else if (menu->cursor < 0)
						menu->cursor = count - 1;
					else
						menu->cursor += ddy[dir];
				}
			
				assert(menu->cursor >= 0);
				assert(menu->cursor < count);
			}
		}
	}

	return eat;
}